

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::EncodeAPIParameterized_HighBDEncoderHighBDFrames_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::EncodeAPIParameterized_HighBDEncoderHighBDFrames_Test>
             *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<unsigned_int,_int,_unsigned_int>_>::SetParam
            ((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x18);
  anon_unknown.dwarf_a078f1::EncodeAPIParameterized_HighBDEncoderHighBDFrames_Test::
  EncodeAPIParameterized_HighBDEncoderHighBDFrames_Test
            ((EncodeAPIParameterized_HighBDEncoderHighBDFrames_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }